

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cio.c
# Opt level: O0

OPJ_SIZE_T
opj_stream_write_data
          (opj_stream_private_t *p_stream,OPJ_BYTE *p_buffer,OPJ_SIZE_T p_size,
          opj_event_mgr_t *p_event_mgr)

{
  uint uVar1;
  opj_bool oVar2;
  opj_stream_private_t *in_RCX;
  uint in_EDX;
  void *in_RSI;
  long in_RDI;
  OPJ_SIZE_T l_write_nb_bytes;
  OPJ_SIZE_T l_remaining_bytes;
  int iVar3;
  uint local_1c;
  void *local_18;
  
  iVar3 = 0;
  local_1c = in_EDX;
  local_18 = in_RSI;
  if ((*(uint *)(in_RDI + 100) & 8) == 0) {
    do {
      uVar1 = *(int *)(in_RDI + 0x60) - *(int *)(in_RDI + 0x50);
      if (local_1c <= uVar1) {
        memcpy(*(void **)(in_RDI + 0x38),local_18,(ulong)local_1c);
        *(ulong *)(in_RDI + 0x38) = *(long *)(in_RDI + 0x38) + (ulong)local_1c;
        *(uint *)(in_RDI + 0x50) = local_1c + *(int *)(in_RDI + 0x50);
        *(ulong *)(in_RDI + 0x58) = (ulong)local_1c + *(long *)(in_RDI + 0x58);
        return local_1c + iVar3;
      }
      if (uVar1 != 0) {
        iVar3 = uVar1 + iVar3;
        memcpy(*(void **)(in_RDI + 0x38),local_18,(ulong)uVar1);
        *(undefined8 *)(in_RDI + 0x38) = *(undefined8 *)(in_RDI + 0x30);
        local_18 = (void *)((long)local_18 + (ulong)uVar1);
        local_1c = local_1c - uVar1;
        *(uint *)(in_RDI + 0x50) = uVar1 + *(int *)(in_RDI + 0x50);
        *(ulong *)(in_RDI + 0x58) = (ulong)uVar1 + *(long *)(in_RDI + 0x58);
      }
      oVar2 = opj_stream_flush(in_RCX,(opj_event_mgr_t *)CONCAT44(uVar1,iVar3));
    } while (oVar2 != 0);
  }
  return 0xffffffff;
}

Assistant:

OPJ_SIZE_T opj_stream_write_data (opj_stream_private_t * p_stream,const OPJ_BYTE * p_buffer,OPJ_SIZE_T p_size, opj_event_mgr_t * p_event_mgr)
{
	OPJ_SIZE_T l_remaining_bytes = 0;
	OPJ_SIZE_T l_write_nb_bytes = 0;

	if
		(p_stream->m_status & opj_stream_e_error)
	{
		return -1;
	}

	while(1)
	{
		l_remaining_bytes = p_stream->m_buffer_size - p_stream->m_bytes_in_buffer;
		// we have more memory than required
		if
			(l_remaining_bytes >= p_size)
		{
			memcpy(p_stream->m_current_data,p_buffer,p_size);
			p_stream->m_current_data += p_size;
			p_stream->m_bytes_in_buffer += p_size;
			l_write_nb_bytes += p_size;
			p_stream->m_byte_offset += p_size;
			return l_write_nb_bytes;
		}

		// we copy data and then do an actual read on the stream
		if
			(l_remaining_bytes)
		{
			l_write_nb_bytes += l_remaining_bytes;
			memcpy(p_stream->m_current_data,p_buffer,l_remaining_bytes);
			p_stream->m_current_data = p_stream->m_stored_data;
			p_buffer += l_remaining_bytes;
			p_size -= l_remaining_bytes;
			p_stream->m_bytes_in_buffer += l_remaining_bytes;
			p_stream->m_byte_offset += l_remaining_bytes;
		}
		if
			(! opj_stream_flush(p_stream, p_event_mgr))
		{
			return -1;
		}
	}

}